

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkwrite.c
# Opt level: O1

int mbedtls_pk_write_pubkey_der(mbedtls_pk_context *key,uchar *buf,size_t size)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  mbedtls_pk_type_t mVar4;
  uint uVar5;
  size_t sVar6;
  uchar *c;
  char *oid;
  size_t oid_len;
  uchar *local_40;
  char *local_38;
  size_t local_30;
  
  local_40 = buf + size;
  uVar1 = mbedtls_pk_write_pubkey(&local_40,buf,key);
  uVar5 = uVar1;
  if (-1 < (int)uVar1) {
    if (local_40 == buf || (long)local_40 - (long)buf < 0) {
      uVar5 = 0xffffff94;
    }
    else {
      local_40[-1] = '\0';
      local_40 = local_40 + -1;
      uVar2 = mbedtls_asn1_write_len(&local_40,buf,(ulong)(uVar1 + 1));
      uVar5 = uVar2;
      if ((-1 < (int)uVar2) &&
         (uVar3 = mbedtls_asn1_write_tag(&local_40,buf,'\x03'), uVar5 = uVar3, -1 < (int)uVar3)) {
        mVar4 = mbedtls_pk_get_type(key);
        uVar5 = mbedtls_oid_get_oid_by_pk_alg(mVar4,&local_38,&local_30);
        if (uVar5 == 0) {
          mVar4 = mbedtls_pk_get_type(key);
          if (mVar4 == MBEDTLS_PK_ECKEY) {
            uVar5 = pk_write_ec_param(&local_40,buf,(mbedtls_ecp_keypair *)key->pk_ctx);
            if ((int)uVar5 < 0) {
              return uVar5;
            }
            sVar6 = (size_t)uVar5;
          }
          else {
            sVar6 = 0;
          }
          uVar5 = mbedtls_asn1_write_algorithm_identifier(&local_40,buf,local_38,local_30,sVar6);
          if (-1 < (int)uVar5) {
            sVar6 = (ulong)uVar5 + (ulong)(uVar1 + 1) + (ulong)uVar3 + (ulong)uVar2;
            uVar1 = mbedtls_asn1_write_len(&local_40,buf,sVar6);
            uVar5 = uVar1;
            if ((-1 < (int)uVar1) &&
               (uVar5 = mbedtls_asn1_write_tag(&local_40,buf,'0'), -1 < (int)uVar5)) {
              uVar5 = uVar1 + (int)sVar6 + uVar5;
            }
          }
        }
      }
    }
  }
  return uVar5;
}

Assistant:

int mbedtls_pk_write_pubkey_der( mbedtls_pk_context *key, unsigned char *buf, size_t size )
{
    int ret;
    unsigned char *c;
    size_t len = 0, par_len = 0, oid_len;
    const char *oid;

    c = buf + size;

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_pk_write_pubkey( &c, buf, key ) );

    if( c - buf < 1 )
        return( MBEDTLS_ERR_ASN1_BUF_TOO_SMALL );

    /*
     *  SubjectPublicKeyInfo  ::=  SEQUENCE  {
     *       algorithm            AlgorithmIdentifier,
     *       subjectPublicKey     BIT STRING }
     */
    *--c = 0;
    len += 1;

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( &c, buf, len ) );
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( &c, buf, MBEDTLS_ASN1_BIT_STRING ) );

    if( ( ret = mbedtls_oid_get_oid_by_pk_alg( mbedtls_pk_get_type( key ),
                                       &oid, &oid_len ) ) != 0 )
    {
        return( ret );
    }

#if defined(MBEDTLS_ECP_C)
    if( mbedtls_pk_get_type( key ) == MBEDTLS_PK_ECKEY )
    {
        MBEDTLS_ASN1_CHK_ADD( par_len, pk_write_ec_param( &c, buf, mbedtls_pk_ec( *key ) ) );
    }
#endif

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_algorithm_identifier( &c, buf, oid, oid_len,
                                                        par_len ) );

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( &c, buf, len ) );
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( &c, buf, MBEDTLS_ASN1_CONSTRUCTED |
                                                MBEDTLS_ASN1_SEQUENCE ) );

    return( (int) len );
}